

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorProto_ExtensionRange::Clear(DescriptorProto_ExtensionRange *this)

{
  uint uVar1;
  LogMessage *other;
  ExtensionRangeOptions *this_00;
  LogMessage local_60;
  LogFinisher local_21;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    this_00 = this->options_;
    if (this_00 == (ExtensionRangeOptions *)0x0) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/descriptor.pb.cc"
                 ,0x91c);
      other = internal::LogMessage::operator<<(&local_60,"CHECK failed: options_ != nullptr: ");
      internal::LogFinisher::operator=(&local_21,other);
      internal::LogMessage::~LogMessage(&local_60);
      this_00 = this->options_;
    }
    ExtensionRangeOptions::Clear(this_00);
  }
  if ((uVar1 & 6) != 0) {
    this->start_ = 0;
    this->end_ = 0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_);
  }
  return;
}

Assistant:

void DescriptorProto_ExtensionRange::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.DescriptorProto.ExtensionRange)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    GOOGLE_DCHECK(options_ != nullptr);
    options_->Clear();
  }
  if (cached_has_bits & 0x00000006u) {
    ::memset(&start_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&end_) -
        reinterpret_cast<char*>(&start_)) + sizeof(end_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}